

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSGlobalVar * add_global_var(JSContext *ctx,JSFunctionDef *s,JSAtom name)

{
  int iVar1;
  JSAtom JVar2;
  undefined4 in_EDX;
  long in_RSI;
  JSContext *in_RDI;
  JSGlobalVar *hf;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  JSContext *in_stack_fffffffffffffff8;
  JSGlobalVar *pJVar3;
  
  iVar1 = js_resize_array(in_stack_fffffffffffffff8,(void **)in_RDI,(int)((ulong)in_RSI >> 0x20),
                          (int *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                          (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  if (iVar1 == 0) {
    iVar1 = *(int *)(in_RSI + 0x11c);
    *(int *)(in_RSI + 0x11c) = iVar1 + 1;
    pJVar3 = (JSGlobalVar *)(*(long *)(in_RSI + 0x128) + (long)iVar1 * 0x10);
    pJVar3->cpool_idx = -1;
    pJVar3->field_0x4 = pJVar3->field_0x4 & 0xfe;
    pJVar3->field_0x4 = pJVar3->field_0x4 & 0xfd;
    pJVar3->field_0x4 = pJVar3->field_0x4 & 0xfb;
    pJVar3->scope_level = *(int *)(in_RSI + 0xe0);
    JVar2 = JS_DupAtom(in_RDI,(JSAtom)((ulong)in_RSI >> 0x20));
    pJVar3->var_name = JVar2;
  }
  else {
    pJVar3 = (JSGlobalVar *)0x0;
  }
  return pJVar3;
}

Assistant:

static JSGlobalVar *add_global_var(JSContext *ctx, JSFunctionDef *s,
                                     JSAtom name)
{
    JSGlobalVar *hf;

    if (js_resize_array(ctx, (void **)&s->global_vars,
                        sizeof(s->global_vars[0]),
                        &s->global_var_size, s->global_var_count + 1))
        return NULL;
    hf = &s->global_vars[s->global_var_count++];
    hf->cpool_idx = -1;
    hf->force_init = FALSE;
    hf->is_lexical = FALSE;
    hf->is_const = FALSE;
    hf->scope_level = s->scope_level;
    hf->var_name = JS_DupAtom(ctx, name);
    return hf;
}